

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftutil.c
# Opt level: O0

void FT_List_Up(FT_List list,FT_ListNode node)

{
  FT_ListNode pFVar1;
  FT_ListNode pFVar2;
  FT_ListNode after;
  FT_ListNode before;
  FT_ListNode node_local;
  FT_List list_local;
  
  if ((list != (FT_List)0x0) && (node != (FT_ListNode)0x0)) {
    pFVar1 = node->prev;
    pFVar2 = node->next;
    if (pFVar1 != (FT_ListNode)0x0) {
      pFVar1->next = pFVar2;
      if (pFVar2 == (FT_ListNode)0x0) {
        list->tail = pFVar1;
      }
      else {
        pFVar2->prev = pFVar1;
      }
      node->prev = (FT_ListNode)0x0;
      node->next = list->head;
      list->head->prev = node;
      list->head = node;
    }
  }
  return;
}

Assistant:

FT_EXPORT_DEF( void )
  FT_List_Up( FT_List      list,
              FT_ListNode  node )
  {
    FT_ListNode  before, after;


    if ( !list || !node )
      return;

    before = node->prev;
    after  = node->next;

    /* check whether we are already on top of the list */
    if ( !before )
      return;

    before->next = after;

    if ( after )
      after->prev = before;
    else
      list->tail = before;

    node->prev       = NULL;
    node->next       = list->head;
    list->head->prev = node;
    list->head       = node;
  }